

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O1

void teardown(void)

{
  pointer pcVar1;
  string *psVar2;
  
  psVar2 = bob_pointer_abi_cxx11_;
  if (bob_pointer_abi_cxx11_ != (string *)0x0) {
    pcVar1 = (bob_pointer_abi_cxx11_->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &bob_pointer_abi_cxx11_->field_2) {
      operator_delete(pcVar1);
    }
    operator_delete(psVar2);
  }
  psVar2 = alice_pointer_abi_cxx11_;
  if (alice_pointer_abi_cxx11_ != (string *)0x0) {
    pcVar1 = (alice_pointer_abi_cxx11_->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &alice_pointer_abi_cxx11_->field_2) {
      operator_delete(pcVar1);
    }
    operator_delete(psVar2);
  }
  psVar2 = exception_pointer_abi_cxx11_;
  if (exception_pointer_abi_cxx11_ != (string *)0x0) {
    pcVar1 = (exception_pointer_abi_cxx11_->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &exception_pointer_abi_cxx11_->field_2) {
      operator_delete(pcVar1);
    }
    operator_delete(psVar2);
    return;
  }
  return;
}

Assistant:

void teardown(void) {
    delete bob_pointer;
    delete alice_pointer;
    delete exception_pointer;
}